

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O1

DecodeStatus decodeMemRIXOperands(MCInst *Inst,uint64_t Imm,int64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus extraout_EAX;
  MCOperand *Op;
  ulong uVar2;
  
  uVar2 = Imm >> 0xe;
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 == 599) {
    MCOperand_CreateReg0(Inst,GP0Regs[uVar2]);
  }
  else {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x350) {
      Op = MCOperand_CreateReg1(Inst,GP0Regs[uVar2]);
      MCInst_insert0(Inst,0,Op);
    }
  }
  MCOperand_CreateImm0(Inst,(long)(Imm << 0x32) >> 0x30);
  MCOperand_CreateReg0(Inst,GP0Regs[uVar2]);
  return extraout_EAX;
}

Assistant:

static DecodeStatus decodeMemRIXOperands(MCInst *Inst, uint64_t Imm,
		int64_t Address, const void *Decoder)
{
	// Decode the memrix field (imm, reg), which has the low 14-bits as the
	// displacement and the next 5 bits as the register #.

	uint64_t Base = Imm >> 14;
	uint64_t Disp = Imm & 0x3FFF;

	// assert(Base < 32 && "Invalid base register");

	if (MCInst_getOpcode(Inst) == PPC_LDU)
		// Add the tied output operand.
		MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	else if (MCInst_getOpcode(Inst) == PPC_STDU)
		MCInst_insert0(Inst, 0, MCOperand_CreateReg1(Inst, GP0Regs[Base]));

	MCOperand_CreateImm0(Inst, SignExtend64(Disp << 2, 16));
	MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	return MCDisassembler_Success;
}